

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

char * copy_trunc(char *p,char *str,int maxl,int quote)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  int iVar5;
  
  pcVar3 = (char *)strlen(str);
  if (quote != 0) {
    *p = '\"';
    p = p + 1;
  }
  if (0 < maxl) {
    pbVar4 = (byte *)(pcVar3 + (long)str);
    iVar5 = 0;
    while( true ) {
      bVar1 = *str;
      pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),bVar1);
      if (bVar1 < 0x20) break;
      uVar2 = fl_utf8len(bVar1);
      pcVar3 = (char *)CONCAT44(extraout_var,uVar2);
      if (((int)uVar2 < 1) || (pbVar4 < (byte *)str + uVar2)) break;
      do {
        bVar1 = *str;
        str = (char *)((byte *)str + 1);
        *p = bVar1;
        p = (char *)((byte *)p + 1);
        uVar2 = (int)pcVar3 - 1;
        pcVar3 = (char *)(ulong)uVar2;
      } while (uVar2 != 0);
      iVar5 = iVar5 + 1;
      if (iVar5 == maxl) break;
    }
  }
  if (*str != 0) {
    ((byte *)p)[0] = 0x2e;
    ((byte *)p)[1] = 0x2e;
    ((byte *)p)[2] = 0x2e;
    ((byte *)p)[3] = 0;
    p = (char *)((byte *)p + 3);
  }
  if (quote != 0) {
    *p = 0x22;
    p = (char *)((byte *)p + 1);
  }
  *p = 0;
  return pcVar3;
}

Assistant:

static char *copy_trunc(char *p, const char *str, int maxl, int quote) {

  int size = 0;				// truncated string size in characters
  int bs;				// size of UTF-8 character in bytes
  const char *end = str + strlen(str);	// end of input string
  if (quote) *p++ = '"';		// opening quote
  while (size < maxl) {			// maximum <maxl> characters
    if (!(*str & (-32))) break;		// end of string (0 or control char)
    bs = fl_utf8len(*str);		// size of next character
    if (bs <= 0) break;			// some error - leave
    if (str + bs > end) break;		// UTF-8 sequence beyond end of string
    while (bs--) *p++ = *str++;		// copy that character into the buffer
    size++;				// count copied characters
  }
  if (*str) {				// string was truncated
    strcpy(p,"..."); p += 3;
  }
  if (quote) *p++ = '"';		// closing quote
  *p = 0;				// terminating null byte
  return p;
}